

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

size_t __thiscall
std::hash<google::protobuf::MapKey>::operator()
          (hash<google::protobuf::MapKey> *this,MapKey *map_key)

{
  bool __val;
  CppType CVar1;
  int32_t __val_00;
  uint32_t __val_01;
  string *__s;
  uint64_t __val_02;
  LogMessage *pLVar2;
  LogFinisher local_d1;
  LogMessage local_d0;
  hash<bool> local_92;
  hash<unsigned_int> local_91;
  uint32_t local_90;
  hash<unsigned_long> local_89;
  uint32_t value_3;
  uint64_t value_2;
  int32_t local_78;
  hash<long> local_71;
  int32_t value_1;
  int64_t value;
  LogMessage local_58;
  MapKey *local_20;
  MapKey *map_key_local;
  hash<google::protobuf::MapKey> *this_local;
  
  local_20 = map_key;
  map_key_local = (MapKey *)this;
  CVar1 = google::protobuf::MapKey::type(map_key);
  switch(CVar1) {
  case CPPTYPE_INT32:
    local_78 = google::protobuf::MapKey::GetInt32Value(local_20);
    __val_00 = google::protobuf::MapKey::GetInt32Value(local_20);
    this_local = (hash<google::protobuf::MapKey> *)
                 hash<int>::operator()((hash<int> *)((long)&value_2 + 7),__val_00);
    break;
  case CPPTYPE_INT64:
    _value_1 = google::protobuf::MapKey::GetInt64Value(local_20);
    this_local = (hash<google::protobuf::MapKey> *)hash<long>::operator()(&local_71,_value_1);
    break;
  case CPPTYPE_UINT32:
    local_90 = google::protobuf::MapKey::GetUInt32Value(local_20);
    __val_01 = google::protobuf::MapKey::GetUInt32Value(local_20);
    this_local = (hash<google::protobuf::MapKey> *)
                 hash<unsigned_int>::operator()(&local_91,__val_01);
    break;
  case CPPTYPE_UINT64:
    _value_3 = google::protobuf::MapKey::GetUInt64Value(local_20);
    __val_02 = google::protobuf::MapKey::GetUInt64Value(local_20);
    this_local = (hash<google::protobuf::MapKey> *)
                 hash<unsigned_long>::operator()(&local_89,__val_02);
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x117);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<(&local_58,"Unsupported");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&value + 3),pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  default:
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x12f);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<(&local_d0,"Can\'t get here.");
    google::protobuf::internal::LogFinisher::operator=(&local_d1,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d0);
    this_local = (hash<google::protobuf::MapKey> *)0x0;
    break;
  case CPPTYPE_BOOL:
    __val = google::protobuf::MapKey::GetBoolValue(local_20);
    this_local = (hash<google::protobuf::MapKey> *)hash<bool>::operator()(&local_92,__val);
    break;
  case CPPTYPE_STRING:
    __s = google::protobuf::MapKey::GetStringValue_abi_cxx11_(local_20);
    this_local = (hash<google::protobuf::MapKey> *)
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&value + 2),__s);
  }
  return (size_t)this_local;
}

Assistant:

size_t operator()(const ::PROTOBUF_NAMESPACE_ID::MapKey& map_key) const {
    switch (map_key.type()) {
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_DOUBLE:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_FLOAT:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_ENUM:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_STRING:
        return hash<std::string>()(map_key.GetStringValue());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_INT64: {
        auto value = map_key.GetInt64Value();
        return hash<decltype(value)>()(value);
      }
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_INT32: {
        auto value = map_key.GetInt32Value();
        return hash<decltype(value)>()(map_key.GetInt32Value());
      }
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_UINT64: {
        auto value = map_key.GetUInt64Value();
        return hash<decltype(value)>()(map_key.GetUInt64Value());
      }
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_UINT32: {
        auto value = map_key.GetUInt32Value();
        return hash<decltype(value)>()(map_key.GetUInt32Value());
      }
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_BOOL: {
        return hash<bool>()(map_key.GetBoolValue());
      }
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }